

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

peer_request __thiscall libtorrent::aux::torrent::to_req(torrent *this,piece_block *p)

{
  int iVar1;
  element_type *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  peer_request pVar5;
  
  this_00 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = (this_00->m_files).m_piece_length;
  iVar4 = 0x4000;
  if (iVar1 < 0x4000) {
    iVar4 = iVar1;
  }
  if (iVar1 < 1) {
    iVar4 = 0x4000;
  }
  iVar4 = iVar4 * p->block_index;
  iVar2 = file_storage::piece_size(&this_00->m_files,(piece_index_t)(p->piece_index).m_val);
  iVar2 = iVar2 - iVar4;
  iVar1 = (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length;
  iVar3 = 0x4000;
  if (iVar1 < 0x4000) {
    iVar3 = iVar1;
  }
  if (iVar1 < 1) {
    iVar3 = 0x4000;
  }
  if (iVar2 <= iVar3) {
    iVar3 = iVar2;
  }
  pVar5.start = iVar4;
  pVar5.piece.m_val = (p->piece_index).m_val;
  pVar5.length = iVar3;
  return pVar5;
}

Assistant:

peer_request torrent::to_req(piece_block const& p) const
	{
		int const block_offset = p.block_index * block_size();
		int const block = std::min(torrent_file().piece_size(
			p.piece_index) - block_offset, block_size());
		TORRENT_ASSERT(block > 0);
		TORRENT_ASSERT(block <= block_size());

		peer_request r;
		r.piece = p.piece_index;
		r.start = block_offset;
		r.length = block;
		return r;
	}